

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

void debug_output_logger(GLenum source,GLenum type,GLuint id,GLenum severity,GLsizei length,
                        GLchar *message,GLvoid *userParam)

{
  char local_68 [8];
  char typestr [32];
  char srcstr [32];
  GLchar *message_local;
  GLsizei length_local;
  GLenum severity_local;
  GLuint id_local;
  GLenum type_local;
  GLenum source_local;
  
  switch(source) {
  case 0x8246:
    strcpy(typestr + 0x18,"OpenGL");
    break;
  case 0x8247:
    strcpy(typestr + 0x18,"Windows");
    break;
  case 0x8248:
    strcpy(typestr + 0x18,"Shader Compiler");
    break;
  case 0x8249:
    strcpy(typestr + 0x18,"Third Party");
    break;
  case 0x824a:
    strcpy(typestr + 0x18,"Application");
    break;
  case 0x824b:
    strcpy(typestr + 0x18,"Other");
    break;
  default:
    strcpy(typestr + 0x18,"???");
  }
  switch(type) {
  case 0x824c:
    strcpy(local_68,"Error");
    break;
  case 0x824d:
    strcpy(local_68,"Deprecated Behavior");
    break;
  case 0x824e:
    strcpy(local_68,"Undefined Behavior");
    break;
  case 0x824f:
    strcpy(local_68,"Portability");
    break;
  case 0x8250:
    strcpy(local_68,"Performance");
    break;
  case 0x8251:
    strcpy(local_68,"Message");
    break;
  default:
    strcpy(local_68,"???");
  }
  if ((severity == 0x9146) || (severity == 0x9147)) {
    fprintf(_stdout,"djg_error: %s %s\n-- Begin -- GL_debug_output\n%s\n-- End -- GL_debug_output\n"
            ,typestr + 0x18,local_68,message);
    fflush(_stdout);
  }
  else if (severity == 0x9147) {
    fprintf(_stdout,"djg_warn: %s %s\n-- Begin -- GL_debug_output\n%s\n-- End -- GL_debug_output\n",
            typestr + 0x18,local_68,message);
    fflush(_stdout);
  }
  return;
}

Assistant:

static void APIENTRY
debug_output_logger(
        GLenum source,
        GLenum type,
        GLuint id,
        GLenum severity,
        GLsizei length,
        const GLchar* message,
        const GLvoid* userParam
        ) {
    char srcstr[32], typestr[32];

    switch(source) {
    case GL_DEBUG_SOURCE_API: strcpy(srcstr, "OpenGL"); break;
    case GL_DEBUG_SOURCE_WINDOW_SYSTEM: strcpy(srcstr, "Windows"); break;
    case GL_DEBUG_SOURCE_SHADER_COMPILER: strcpy(srcstr, "Shader Compiler"); break;
    case GL_DEBUG_SOURCE_THIRD_PARTY: strcpy(srcstr, "Third Party"); break;
    case GL_DEBUG_SOURCE_APPLICATION: strcpy(srcstr, "Application"); break;
    case GL_DEBUG_SOURCE_OTHER: strcpy(srcstr, "Other"); break;
    default: strcpy(srcstr, "???"); break;
    };

    switch(type) {
    case GL_DEBUG_TYPE_ERROR: strcpy(typestr, "Error"); break;
    case GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR: strcpy(typestr, "Deprecated Behavior"); break;
    case GL_DEBUG_TYPE_UNDEFINED_BEHAVIOR: strcpy(typestr, "Undefined Behavior"); break;
    case GL_DEBUG_TYPE_PORTABILITY: strcpy(typestr, "Portability"); break;
    case GL_DEBUG_TYPE_PERFORMANCE: strcpy(typestr, "Performance"); break;
    case GL_DEBUG_TYPE_OTHER: strcpy(typestr, "Message"); break;
    default: strcpy(typestr, "???"); break;
    }

    if(severity == GL_DEBUG_SEVERITY_HIGH || severity == GL_DEBUG_SEVERITY_MEDIUM) {
        LOG("djg_error: %s %s\n"                \
            "-- Begin -- GL_debug_output\n" \
            "%s\n"                              \
            "-- End -- GL_debug_output\n",
            srcstr, typestr, message);
    } else if(severity == GL_DEBUG_SEVERITY_MEDIUM) {
        LOG("djg_warn: %s %s\n"                 \
            "-- Begin -- GL_debug_output\n" \
            "%s\n"                              \
            "-- End -- GL_debug_output\n",
            srcstr, typestr, message);
    }
}